

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O1

void __thiscall wasm::WasmBinaryWriter::writeImports(WasmBinaryWriter *this)

{
  pointer puVar1;
  Function *pFVar2;
  char *pcVar3;
  BufferWithRandomAccess *pBVar4;
  pointer puVar5;
  Global *pGVar6;
  pointer puVar7;
  Tag *pTVar8;
  pointer puVar9;
  Memory *pMVar10;
  Address AVar11;
  pointer puVar12;
  Table *pTVar13;
  int32_t start;
  size_t in_RCX;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  void *__buf_04;
  void *__buf_05;
  void *__buf_06;
  void *__buf_07;
  unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_> *import_4;
  pointer puVar14;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *import;
  pointer puVar15;
  pointer puVar16;
  pointer puVar17;
  pointer puVar18;
  string_view name;
  string_view name_00;
  string_view name_01;
  string_view name_02;
  string_view name_03;
  LEB<unsigned_int,_unsigned_char> local_34;
  
  local_34.value =
       ImportInfo::getNumImports
                 ((this->importInfo)._M_t.
                  super___uniq_ptr_impl<wasm::ImportInfo,_std::default_delete<wasm::ImportInfo>_>.
                  _M_t.
                  super__Tuple_impl<0UL,_wasm::ImportInfo_*,_std::default_delete<wasm::ImportInfo>_>
                  .super__Head_base<0UL,_wasm::ImportInfo_*,_false>._M_head_impl);
  if (local_34.value != 0) {
    start = startSection<wasm::BinaryConsts::Section>(this,Import);
    LEB<unsigned_int,_unsigned_char>::write(&local_34,(int)this->o,__buf,in_RCX);
    puVar1 = (this->wasm->functions).
             super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar15 = (this->wasm->functions).
                   super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar15 != puVar1;
        puVar15 = puVar15 + 1) {
      pFVar2 = (puVar15->_M_t).
               super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
               super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
      pcVar3 = *(char **)((long)&(pFVar2->super_Importable).module + 8);
      if (pcVar3 != (char *)0x0) {
        name._M_str = pcVar3;
        name._M_len = (pFVar2->super_Importable).module.super_IString.str._M_len;
        writeInlineString(this,name);
        writeInlineString(this,*(string_view *)&(pFVar2->super_Importable).base);
        local_34.value = 0;
        LEB<unsigned_int,_unsigned_char>::write(&local_34,(int)this->o,__buf_00,in_RCX);
        pBVar4 = this->o;
        local_34.value = getTypeIndex(this,(HeapType)(pFVar2->type).id);
        LEB<unsigned_int,_unsigned_char>::write(&local_34,(int)pBVar4,__buf_01,in_RCX);
      }
    }
    puVar16 = (this->wasm->globals).
              super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar5 = (this->wasm->globals).
             super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar16 != puVar5) {
      do {
        pGVar6 = (puVar16->_M_t).
                 super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
                 super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
                 super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
        pcVar3 = *(char **)((long)&(pGVar6->super_Importable).module + 8);
        if (pcVar3 != (char *)0x0) {
          name_00._M_str = pcVar3;
          name_00._M_len = (pGVar6->super_Importable).module.super_IString.str._M_len;
          writeInlineString(this,name_00);
          writeInlineString(this,*(string_view *)&(pGVar6->super_Importable).base);
          local_34.value = 3;
          LEB<unsigned_int,_unsigned_char>::write(&local_34,(int)this->o,__buf_02,in_RCX);
          writeType(this,(Type)(pGVar6->type).id);
          local_34.value = (uint)pGVar6->mutable_;
          LEB<unsigned_int,_unsigned_char>::write(&local_34,(int)this->o,__buf_03,in_RCX);
        }
        puVar16 = puVar16 + 1;
      } while (puVar16 != puVar5);
    }
    puVar7 = (this->wasm->tags).
             super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar17 = (this->wasm->tags).
                   super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar17 != puVar7;
        puVar17 = puVar17 + 1) {
      pTVar8 = (puVar17->_M_t).super___uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>.
               _M_t.super__Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>.
               super__Head_base<0UL,_wasm::Tag_*,_false>._M_head_impl;
      pcVar3 = *(char **)((long)&(pTVar8->super_Importable).module + 8);
      if (pcVar3 != (char *)0x0) {
        name_01._M_str = pcVar3;
        name_01._M_len = (pTVar8->super_Importable).module.super_IString.str._M_len;
        writeInlineString(this,name_01);
        writeInlineString(this,*(string_view *)&(pTVar8->super_Importable).base);
        local_34.value = 4;
        LEB<unsigned_int,_unsigned_char>::write(&local_34,(int)this->o,__buf_04,in_RCX);
        local_34.value = local_34.value & 0xffffff00;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                  (&this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,
                   (uchar *)&local_34);
        pBVar4 = this->o;
        local_34.value = getTypeIndex(this,(HeapType)(pTVar8->type).id);
        LEB<unsigned_int,_unsigned_char>::write(&local_34,(int)pBVar4,__buf_05,in_RCX);
      }
    }
    puVar18 = (this->wasm->memories).
              super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar9 = (this->wasm->memories).
             super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar18 != puVar9) {
      do {
        pMVar10 = (puVar18->_M_t).
                  super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
                  super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                  super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl;
        pcVar3 = *(char **)((long)&(pMVar10->super_Importable).module + 8);
        if (pcVar3 != (char *)0x0) {
          name_02._M_str = pcVar3;
          name_02._M_len = (pMVar10->super_Importable).module.super_IString.str._M_len;
          writeInlineString(this,name_02);
          writeInlineString(this,*(string_view *)&(pMVar10->super_Importable).base);
          local_34.value = 2;
          LEB<unsigned_int,_unsigned_char>::write(&local_34,(int)this->o,__buf_06,in_RCX);
          AVar11.addr = (pMVar10->max).addr;
          in_RCX = (size_t)(AVar11.addr != 0xffffffffffffffff);
          writeResizableLimits
                    (this,(Address)(pMVar10->initial).addr,AVar11,AVar11.addr != 0xffffffffffffffff,
                     pMVar10->shared,(pMVar10->addressType).id == 3);
        }
        puVar18 = puVar18 + 1;
      } while (puVar18 != puVar9);
    }
    puVar12 = (this->wasm->tables).
              super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar14 = (this->wasm->tables).
                   super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar14 != puVar12;
        puVar14 = puVar14 + 1) {
      pTVar13 = (puVar14->_M_t).
                super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>._M_t.
                super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
                super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl;
      pcVar3 = *(char **)((long)&(pTVar13->super_Importable).module + 8);
      if (pcVar3 != (char *)0x0) {
        name_03._M_str = pcVar3;
        name_03._M_len = (pTVar13->super_Importable).module.super_IString.str._M_len;
        writeInlineString(this,name_03);
        writeInlineString(this,*(string_view *)&(pTVar13->super_Importable).base);
        local_34.value = 1;
        LEB<unsigned_int,_unsigned_char>::write(&local_34,(int)this->o,__buf_07,in_RCX);
        writeType(this,(Type)(pTVar13->type).id);
        AVar11.addr = (pTVar13->max).addr;
        in_RCX = (size_t)(AVar11.addr != 0xffffffff);
        writeResizableLimits
                  (this,(Address)(pTVar13->initial).addr,AVar11,AVar11.addr != 0xffffffff,false,
                   (pTVar13->addressType).id == 3);
      }
    }
    finishSection(this,start);
  }
  return;
}

Assistant:

void WasmBinaryWriter::writeImports() {
  auto num = importInfo->getNumImports();
  if (num == 0) {
    return;
  }
  auto start = startSection(BinaryConsts::Section::Import);
  o << U32LEB(num);
  auto writeImportHeader = [&](Importable* import) {
    writeInlineString(import->module.str);
    writeInlineString(import->base.str);
  };
  ModuleUtils::iterImportedFunctions(*wasm, [&](Function* func) {
    writeImportHeader(func);
    o << U32LEB(int32_t(ExternalKind::Function));
    o << U32LEB(getTypeIndex(func->type));
  });
  ModuleUtils::iterImportedGlobals(*wasm, [&](Global* global) {
    writeImportHeader(global);
    o << U32LEB(int32_t(ExternalKind::Global));
    writeType(global->type);
    o << U32LEB(global->mutable_);
  });
  ModuleUtils::iterImportedTags(*wasm, [&](Tag* tag) {
    writeImportHeader(tag);
    o << U32LEB(int32_t(ExternalKind::Tag));
    o << uint8_t(0); // Reserved 'attribute' field. Always 0.
    o << U32LEB(getTypeIndex(tag->type));
  });
  ModuleUtils::iterImportedMemories(*wasm, [&](Memory* memory) {
    writeImportHeader(memory);
    o << U32LEB(int32_t(ExternalKind::Memory));
    writeResizableLimits(memory->initial,
                         memory->max,
                         memory->hasMax(),
                         memory->shared,
                         memory->is64());
  });
  ModuleUtils::iterImportedTables(*wasm, [&](Table* table) {
    writeImportHeader(table);
    o << U32LEB(int32_t(ExternalKind::Table));
    writeType(table->type);
    writeResizableLimits(table->initial,
                         table->max,
                         table->hasMax(),
                         /*shared=*/false,
                         table->is64());
  });
  finishSection(start);
}